

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O0

uint32_t InstructionSet::x86::
         address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)2,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                   (Instruction<false> *instruction,DataPointer pointer,Context *context)

{
  Context *instruction_00;
  Source source;
  type_conflict3 tVar1;
  ImmediateT IVar2;
  int iVar3;
  char *pcVar4;
  undefined6 in_register_00000032;
  unsigned_short local_26;
  uint local_24;
  uint16_t zero;
  Context *pCStack_20;
  uint32_t address;
  Context *context_local;
  Instruction<false> *instruction_local;
  DataPointer pointer_local;
  
  local_26 = 0;
  pCStack_20 = context;
  context_local = (Context *)instruction;
  instruction_local._6_2_ = pointer;
  pcVar4 = DataPointer::index((DataPointer *)((long)&instruction_local + 6),
                              (char *)CONCAT62(in_register_00000032,pointer),(int)context);
  tVar1 = resolve<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (instruction,(Source)pcVar4,instruction_local._6_2_,pCStack_20,&local_26,
                     (unsigned_short *)0x0);
  local_24 = (uint)tVar1;
  IVar2 = Instruction<false>::offset((Instruction<false> *)context_local);
  instruction_00 = context_local;
  iVar3 = IVar2 + local_24;
  local_24 = iVar3;
  source = DataPointer::base((DataPointer *)((long)&instruction_local + 6));
  tVar1 = resolve<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    ((Instruction<false> *)instruction_00,source,instruction_local._6_2_,pCStack_20,
                     (unsigned_short *)0x0,(unsigned_short *)0x0);
  return iVar3 + (uint)tVar1;
}

Assistant:

uint32_t address(
	InstructionT &instruction,
	DataPointer pointer,
	ContextT &context
) {
	if constexpr (source == Source::DirectAddress) {
		return instruction.offset();
	}

	uint32_t address;
	uint16_t zero = 0;
	address = resolve<uint16_t, AccessType::Read>(instruction, pointer.index(), pointer, context, &zero);
	if constexpr (is_32bit(ContextT::model)) {
		address <<= pointer.scale();
	}
	address += instruction.offset();

	if constexpr (source == Source::IndirectNoBase) {
		return address;
	}
	return address + resolve<uint16_t, AccessType::Read>(instruction, pointer.base(), pointer, context);
}